

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O2

size_t menu_dynamic_longest_entry(menu_conflict *m)

{
  undefined8 *puVar1;
  size_t sVar2;
  void **ppvVar3;
  ulong uVar4;
  
  uVar4 = 0;
  ppvVar3 = &m->menu_data;
  while (puVar1 = (undefined8 *)*ppvVar3, puVar1 != (undefined8 *)0x0) {
    sVar2 = strlen((char *)*puVar1);
    if (uVar4 < sVar2) {
      uVar4 = sVar2;
    }
    ppvVar3 = (void **)(puVar1 + 2);
  }
  return uVar4;
}

Assistant:

size_t menu_dynamic_longest_entry(struct menu *m)
{
	size_t biggest = 0;
	size_t current;

	struct menu_entry *entry;

	for (entry = menu_priv(m); entry; entry = entry->next) {
		current = strlen(entry->text);
		if (current > biggest)
			biggest = current;
	}

	return biggest;
}